

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

DirHandle * createDirHandle(PHYSFS_Io *io,char *newDir,char *mountPoint,int forWriting)

{
  char *pcVar1;
  code *pcVar2;
  undefined8 uVar3;
  _func_void_ptr_PHYSFS_uint64 *p_Var4;
  undefined1 *ptr;
  size_t sVar5;
  int iVar6;
  size_t sVar7;
  ulong len_00;
  char *pcVar8;
  void *pvVar9;
  undefined1 *puVar10;
  undefined1 auStack_68 [8];
  _func_void_ptr_PHYSFS_uint64 *local_60;
  _func_void_ptr_PHYSFS_uint64 *local_58;
  undefined1 *local_50;
  ulong local_48;
  size_t len;
  char *tmpmntpnt;
  DirHandle *dirHandle;
  char *pcStack_28;
  int forWriting_local;
  char *mountPoint_local;
  char *newDir_local;
  PHYSFS_Io *io_local;
  
  puVar10 = auStack_68;
  tmpmntpnt = (char *)0x0;
  len = 0;
  dirHandle._4_4_ = forWriting;
  pcStack_28 = mountPoint;
  mountPoint_local = newDir;
  newDir_local = (char *)io;
  if (newDir == (char *)0x0) {
    __assert_fail("newDir != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                  ,0x412,"DirHandle *createDirHandle(PHYSFS_Io *, const char *, const char *, int)")
    ;
  }
  if (mountPoint != (char *)0x0) {
    sVar7 = strlen(mountPoint);
    len_00 = sVar7 + 1;
    if (len_00 < 0x100) {
      local_50 = auStack_68 + -(sVar7 + 0x18 & 0xfffffffffffffff0);
      puVar10 = local_50;
    }
    else {
      local_50 = (undefined1 *)0x0;
      puVar10 = auStack_68;
    }
    ptr = local_50;
    local_48 = len_00;
    *(undefined8 *)(puVar10 + -8) = 0x108605;
    pcVar8 = (char *)__PHYSFS_initSmallAlloc(ptr,len_00);
    pcVar1 = pcStack_28;
    len = (size_t)pcVar8;
    if (pcVar8 == (char *)0x0) {
      *(undefined8 *)(puVar10 + -8) = 0x10861a;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      goto LAB_0010874b;
    }
    *(undefined8 *)(puVar10 + -8) = 0x10862e;
    iVar6 = sanitizePlatformIndependentPath(pcVar1,pcVar8);
    if (iVar6 == 0) goto LAB_0010874b;
    pcStack_28 = (char *)len;
  }
  pcVar8 = newDir_local;
  pcVar1 = mountPoint_local;
  iVar6 = dirHandle._4_4_;
  *(undefined8 *)(puVar10 + -8) = 0x108650;
  tmpmntpnt = (char *)openDirectory((PHYSFS_Io *)pcVar8,pcVar1,iVar6);
  pcVar1 = mountPoint_local;
  if ((DirHandle *)tmpmntpnt != (DirHandle *)0x0) {
    local_58 = __PHYSFS_AllocatorHooks.Malloc;
    *(undefined8 *)(puVar10 + -8) = 0x108676;
    sVar7 = strlen(pcVar1);
    p_Var4 = local_58;
    *(undefined8 *)(puVar10 + -8) = 0x108683;
    pvVar9 = (*p_Var4)(sVar7 + 1);
    pcVar1 = mountPoint_local;
    *(void **)(tmpmntpnt + 8) = pvVar9;
    if (*(long *)(tmpmntpnt + 8) != 0) {
      pcVar8 = *(char **)(tmpmntpnt + 8);
      *(undefined8 *)(puVar10 + -8) = 0x1086bb;
      strcpy(pcVar8,pcVar1);
      pcVar1 = pcStack_28;
      if ((pcStack_28 != (char *)0x0) && (*pcStack_28 != '\0')) {
        local_60 = __PHYSFS_AllocatorHooks.Malloc;
        *(undefined8 *)(puVar10 + -8) = 0x1086e2;
        sVar7 = strlen(pcVar1);
        p_Var4 = local_60;
        *(undefined8 *)(puVar10 + -8) = 0x1086ef;
        pvVar9 = (*p_Var4)(sVar7 + 2);
        pcVar1 = pcStack_28;
        *(void **)(tmpmntpnt + 0x10) = pvVar9;
        if (*(long *)(tmpmntpnt + 0x10) == 0) {
          *(undefined8 *)(puVar10 + -8) = 0x108711;
          PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
          goto LAB_0010874b;
        }
        pcVar8 = *(char **)(tmpmntpnt + 0x10);
        *(undefined8 *)(puVar10 + -8) = 0x108724;
        strcpy(pcVar8,pcVar1);
        pcVar1 = *(char **)(tmpmntpnt + 0x10);
        *(undefined8 *)(puVar10 + -8) = 0x108738;
        strcat(pcVar1,"/");
      }
      sVar5 = len;
      *(undefined8 *)(puVar10 + -8) = 0x108741;
      __PHYSFS_smallFree((void *)sVar5);
      return (DirHandle *)tmpmntpnt;
    }
    *(undefined8 *)(puVar10 + -8) = 0x1086a3;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
LAB_0010874b:
  if (tmpmntpnt != (char *)0x0) {
    pcVar2 = *(code **)(*(long *)(tmpmntpnt + 0x28) + 0x70);
    uVar3 = *(undefined8 *)tmpmntpnt;
    *(undefined8 *)(puVar10 + -8) = 0x108767;
    (*pcVar2)(uVar3);
    pvVar9 = *(void **)(tmpmntpnt + 8);
    *(undefined8 *)(puVar10 + -8) = 0x108778;
    (*__PHYSFS_AllocatorHooks.Free)(pvVar9);
    pvVar9 = *(void **)(tmpmntpnt + 0x10);
    *(undefined8 *)(puVar10 + -8) = 0x108789;
    (*__PHYSFS_AllocatorHooks.Free)(pvVar9);
    pcVar1 = tmpmntpnt;
    *(undefined8 *)(puVar10 + -8) = 0x108796;
    (*__PHYSFS_AllocatorHooks.Free)(pcVar1);
  }
  sVar5 = len;
  *(undefined8 *)(puVar10 + -8) = 0x10879f;
  __PHYSFS_smallFree((void *)sVar5);
  return (DirHandle *)0x0;
}

Assistant:

static DirHandle *createDirHandle(PHYSFS_Io *io, const char *newDir,
                                  const char *mountPoint, int forWriting)
{
    DirHandle *dirHandle = NULL;
    char *tmpmntpnt = NULL;

    assert(newDir != NULL);  /* should have caught this higher up. */

    if (mountPoint != NULL)
    {
        const size_t len = strlen(mountPoint) + 1;
        tmpmntpnt = (char *) __PHYSFS_smallAlloc(len);
        GOTO_IF(!tmpmntpnt, PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
        if (!sanitizePlatformIndependentPath(mountPoint, tmpmntpnt))
            goto badDirHandle;
        mountPoint = tmpmntpnt;  /* sanitized version. */
    } /* if */

    dirHandle = openDirectory(io, newDir, forWriting);
    GOTO_IF_ERRPASS(!dirHandle, badDirHandle);

    dirHandle->dirName = (char *) allocator.Malloc(strlen(newDir) + 1);
    GOTO_IF(!dirHandle->dirName, PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
    strcpy(dirHandle->dirName, newDir);

    if ((mountPoint != NULL) && (*mountPoint != '\0'))
    {
        dirHandle->mountPoint = (char *)allocator.Malloc(strlen(mountPoint)+2);
        if (!dirHandle->mountPoint)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
        strcpy(dirHandle->mountPoint, mountPoint);
        strcat(dirHandle->mountPoint, "/");
    } /* if */

    __PHYSFS_smallFree(tmpmntpnt);
    return dirHandle;

badDirHandle:
    if (dirHandle != NULL)
    {
        dirHandle->funcs->closeArchive(dirHandle->opaque);
        allocator.Free(dirHandle->dirName);
        allocator.Free(dirHandle->mountPoint);
        allocator.Free(dirHandle);
    } /* if */

    __PHYSFS_smallFree(tmpmntpnt);
    return NULL;
}